

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImGuiWindow *window;
  ImGuiTableColumn *clip_rect;
  int idx;
  ImDrawList *draw_list;
  uint uVar1;
  float fVar2;
  float fVar3;
  
  table->CurrentColumn = column_n;
  clip_rect = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  window = table->InnerWindow;
  fVar3 = (&clip_rect->StartXRows)[(byte)table->field_0x94 & 1];
  if ((clip_rect->Flags & 0x4000) != 0) {
    fVar3 = fVar3 + table->RowIndentOffsetX;
  }
  (window->DC).CursorPos.x = fVar3;
  fVar2 = table->RowPosY1 + table->CellPaddingY;
  (window->DC).CursorPos.y = fVar2;
  (window->DC).CursorMaxPos.x = fVar3;
  (window->DC).ColumnsOffset.x = (fVar3 - (window->Pos).x) - (window->DC).Indent.x;
  (window->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (window->DC).LastItemId = 0;
  (window->WorkRect).Min.y = fVar2;
  (window->WorkRect).Min.x = clip_rect->MinX + table->CellPaddingX1;
  (window->WorkRect).Max.x = clip_rect->MaxX - table->CellPaddingX2;
  if (clip_rect->IsVisible == false) {
    uVar1 = -(uint)(table->RowPosY2 <= fVar2);
    (window->DC).CursorPos.y = (float)(~uVar1 & (uint)table->RowPosY2 | (uint)fVar2 & uVar1);
  }
  window->SkipItems = clip_rect->SkipItems;
  if ((table->Flags & 0x4000) == 0) {
    SetWindowClipRectBeforeSetChannel(window,&clip_rect->ClipRect);
    draw_list = window->DrawList;
    idx = (int)clip_rect->DrawChannelCurrent;
  }
  else {
    draw_list = window->DrawList;
    idx = 1;
  }
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,draw_list,idx);
  return;
}

Assistant:

void    ImGui::TableBeginCell(ImGuiTable* table, int column_n)
{
    table->CurrentColumn = column_n;
    ImGuiTableColumn* column = &table->Columns[column_n];
    ImGuiWindow* window = table->InnerWindow;

    // Start position is roughly ~~ CellRect.Min + CellPadding + Indent
    float start_x = (table->RowFlags & ImGuiTableRowFlags_Headers) ? column->StartXHeaders : column->StartXRows;
    if (column->Flags & ImGuiTableColumnFlags_IndentEnable)
        start_x += table->RowIndentOffsetX; // ~~ += window.DC.Indent.x - table->HostIndentX, except we locked it for the row.

    window->DC.CursorPos.x = start_x;
    window->DC.CursorPos.y = table->RowPosY1 + table->CellPaddingY;
    window->DC.CursorMaxPos.x = window->DC.CursorPos.x;
    window->DC.ColumnsOffset.x = start_x - window->Pos.x - window->DC.Indent.x; // FIXME-WORKRECT
    window->DC.CurrLineTextBaseOffset = table->RowTextBaseline;
    window->DC.LastItemId = 0;

    window->WorkRect.Min.y = window->DC.CursorPos.y;
    window->WorkRect.Min.x = column->MinX + table->CellPaddingX1;
    window->WorkRect.Max.x = column->MaxX - table->CellPaddingX2;

    // To allow ImGuiListClipper to function we propagate our row height
    if (!column->IsVisible)
        window->DC.CursorPos.y = ImMax(window->DC.CursorPos.y, table->RowPosY2);

    window->SkipItems = column->SkipItems;
    if (table->Flags & ImGuiTableFlags_NoClipX)
    {
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 1);
    }
    else
    {
        SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
    }
}